

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_trim(bitset_t *bitset)

{
  void *pvVar1;
  long *in_RDI;
  uint64_t *newarray;
  size_t newsize;
  size_t in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  long local_18;
  _Bool local_1;
  
  local_18 = in_RDI[1];
  while ((local_18 != 0 && (*(long *)(*in_RDI + (local_18 + -1) * 8) == 0))) {
    local_18 = local_18 + -1;
  }
  if (in_RDI[2] == local_18) {
    local_1 = true;
  }
  else {
    pvVar1 = roaring_realloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (pvVar1 == (void *)0x0) {
      local_1 = false;
    }
    else {
      *in_RDI = (long)pvVar1;
      in_RDI[2] = local_18;
      in_RDI[1] = local_18;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool bitset_trim(bitset_t *bitset) {
    size_t newsize = bitset->arraysize;
    while (newsize > 0) {
        if (bitset->array[newsize - 1] == 0)
            newsize -= 1;
        else
            break;
    }
    if (bitset->capacity == newsize) return true;  // nothing to do
    uint64_t *newarray;
    if ((newarray = (uint64_t *)roaring_realloc(
             bitset->array, sizeof(uint64_t) * newsize)) == NULL) {
        return false;
    }
    bitset->array = newarray;
    bitset->capacity = newsize;
    bitset->arraysize = newsize;
    return true;
}